

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O0

int msr_is_zone_clamped(raplcap_msr_ctx *ctx,raplcap_zone zone,uint64_t msrval,int *cl_long,
                       int *cl_short)

{
  byte local_36;
  byte local_35;
  int local_34;
  uint8_t cl2_shift;
  uint8_t cl1_shift;
  uint *puStack_30;
  int ret;
  int *cl_short_local;
  int *cl_long_local;
  uint64_t msrval_local;
  raplcap_msr_ctx *prStack_10;
  raplcap_zone zone_local;
  raplcap_msr_ctx *ctx_local;
  
  puStack_30 = (uint *)cl_short;
  cl_short_local = cl_long;
  cl_long_local = (int *)msrval;
  msrval_local._4_4_ = zone;
  prStack_10 = ctx;
  if (ctx != (raplcap_msr_ctx *)0x0) {
    local_34 = 0;
    local_35 = 0x10;
    local_36 = 0x30;
    zone_clamped_quirks(ctx,zone,&local_35,&local_36);
    if (cl_short_local != (int *)0x0) {
      *cl_short_local = (uint)(((ulong)cl_long_local >> (local_35 & 0x3f) & 1) == 1);
      local_34 = local_34 + 1;
    }
    if ((puStack_30 != (uint *)0x0) && (1 < prStack_10->cfg[msrval_local._4_4_].constraints)) {
      *puStack_30 = (uint)(((ulong)cl_long_local >> (local_36 & 0x3f) & 1) == 1);
      local_34 = local_34 + 1;
    }
    return local_34;
  }
  __assert_fail("ctx != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0x238,
                "int msr_is_zone_clamped(const raplcap_msr_ctx *, raplcap_zone, uint64_t, int *, int *)"
               );
}

Assistant:

int msr_is_zone_clamped(const raplcap_msr_ctx* ctx, raplcap_zone zone, uint64_t msrval,
                        int* cl_long, int* cl_short) {
  assert(ctx != NULL);
  int ret = 0;
  uint8_t cl1_shift = CL1_SHIFT;
  uint8_t cl2_shift = CL2_SHIFT;
  zone_clamped_quirks(ctx, zone, &cl1_shift, &cl2_shift);
  if (cl_long != NULL) {
    *cl_long = ((msrval >> cl1_shift) & CL_MASK) == 0x1;
    raplcap_log(DEBUG, "msr_is_zone_clamped: zone=%d, long_term: clamp=%d\n", zone, *cl_long);
    ret++;
  }
  if (cl_short != NULL && HAS_SHORT_TERM(ctx, zone)) {
    *cl_short = ((msrval >> cl2_shift) & CL_MASK) == 0x1;
    raplcap_log(DEBUG, "msr_is_zone_clamped: zone=%d, short_term: clamp=%d\n", zone, *cl_short);
    ret++;
  }
  return ret;
}